

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O0

void __thiscall BigInteger::_divide_by_2(BigInteger *this)

{
  bool bVar1;
  reference puVar2;
  reverse_iterator i;
  bool carry;
  reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_ffffffffffffff98;
  BigInteger *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  byte local_9;
  
  local_9 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rbegin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  while( true ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::rend
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (!bVar1) break;
    if (local_9 == 0) {
      in_stack_ffffffffffffffa0 =
           (BigInteger *)
           std::
           reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)in_stack_ffffffffffffffa0);
      local_9 = *(byte *)&(in_stack_ffffffffffffffa0->digits).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
      in_stack_ffffffffffffff98 =
           (reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)std::
              reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           *)in_stack_ffffffffffffffa0);
      *(uint *)&(in_stack_ffffffffffffff98->current)._M_current =
           *(uint *)&(in_stack_ffffffffffffff98->current)._M_current >> 1;
    }
    else {
      puVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)in_stack_ffffffffffffffa0);
      local_9 = (byte)*puVar2;
      puVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffac = (*puVar2 >> 1) + 500000000;
      puVar2 = std::
               reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)in_stack_ffffffffffffffa0);
      *puVar2 = in_stack_ffffffffffffffac;
    }
    local_9 = local_9 & 1;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)in_stack_ffffffffffffffa0);
  }
  normalize(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void BigInteger::_divide_by_2() noexcept
{
    bool carry = false;
    for(auto i = digits.rbegin(); i != digits.rend(); ++i)
    {
        if(carry)
        {
            carry = *i % 2;
            *i = *i / 2 + BLOCK_MOD / 2;
        }
        else
        {
            carry = *i % 2;
            *i /= 2;
        }
    }
    normalize();
}